

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::prepend_move(xml_node *this,xml_node *moved)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  xml_node_struct **ppxVar4;
  xml_node_struct *pxVar5;
  xml_node *pxVar6;
  xml_node_struct *pxVar7;
  xml_node local_18;
  
  pxVar6 = &local_18;
  bVar3 = impl::anon_unknown_0::allow_move(this,moved);
  if (!bVar3) {
    xml_node(&local_18);
    goto LAB_00189d4e;
  }
  pxVar5 = moved->_root;
  pxVar1 = pxVar5->parent;
  pxVar2 = pxVar5->next_sibling;
  if (pxVar2 == (xml_node_struct *)0x0) {
    pxVar7 = pxVar1->first_child;
    pxVar5 = pxVar5->prev_sibling_c;
    if (pxVar7 != (xml_node_struct *)0x0) goto LAB_00189d06;
  }
  else {
    pxVar5 = pxVar5->prev_sibling_c;
    pxVar7 = pxVar2;
LAB_00189d06:
    pxVar7->prev_sibling_c = pxVar5;
  }
  ppxVar4 = &pxVar1->first_child;
  if (pxVar5->next_sibling != (xml_node_struct *)0x0) {
    ppxVar4 = &pxVar5->next_sibling;
  }
  *ppxVar4 = pxVar2;
  pxVar5 = moved->_root;
  pxVar1 = this->_root;
  pxVar5->parent = pxVar1;
  pxVar2 = pxVar1->first_child;
  pxVar7 = pxVar5;
  if (pxVar2 != (xml_node_struct *)0x0) {
    pxVar5->prev_sibling_c = pxVar2->prev_sibling_c;
    pxVar7 = pxVar2;
  }
  pxVar7->prev_sibling_c = pxVar5;
  pxVar5->next_sibling = pxVar2;
  pxVar1->first_child = pxVar5;
  pxVar6 = moved;
LAB_00189d4e:
  return (xml_node)pxVar6->_root;
}

Assistant:

PUGI__FN xml_node xml_node::prepend_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::remove_node(moved._root);
		impl::prepend_node(moved._root, _root);

		return moved;
	}